

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ast.c
# Opt level: O1

gnode_t * gnode_variable_decl_create
                    (gtoken_s token,gtoken_t type,gtoken_t access_specifier,
                    gtoken_t storage_specifier,gnode_r *declarations,gnode_t *decl)

{
  gnode_t *pgVar1;
  
  pgVar1 = (gnode_t *)gravity_calloc((gravity_vm *)0x0,1,0x60);
  pgVar1->tag = NODE_VARIABLE_DECL;
  (pgVar1->token).type = token.type;
  (pgVar1->token).lineno = token.lineno;
  (pgVar1->token).colno = token.colno;
  (pgVar1->token).position = token.position;
  (pgVar1->token).bytes = token.bytes;
  (pgVar1->token).length = token.length;
  (pgVar1->token).fileid = token.fileid;
  (pgVar1->token).builtin = token.builtin;
  (pgVar1->token).value = token.value;
  pgVar1->decl = decl;
  pgVar1[1].tag = type;
  pgVar1[1].refcount = access_specifier;
  pgVar1[1].block_length = storage_specifier;
  *(gnode_r **)&pgVar1[1].token = declarations;
  return pgVar1;
}

Assistant:

gnode_t *gnode_variable_decl_create (gtoken_s token, gtoken_t type, gtoken_t access_specifier, gtoken_t storage_specifier, gnode_r *declarations, gnode_t *decl) {
    gnode_variable_decl_t *node = (gnode_variable_decl_t *)mem_alloc(NULL, sizeof(gnode_variable_decl_t));

    SETBASE(node, NODE_VARIABLE_DECL, token);
    SETDECL(node, decl);
    node->type = type;
    node->access = access_specifier;
    node->storage = storage_specifier;
    node->decls = declarations;

    return (gnode_t *)node;
}